

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>
  *this_00;
  Fad<double> *pFVar7;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar8;
  double *pdVar9;
  value_type vVar10;
  
  this_00 = &this->right_->fadexpr_;
  pFVar7 = (this->left_->fadexpr_).right_;
  pdVar9 = &pFVar7->defaultVal;
  if ((pFVar7->dx_).num_elts != 0) {
    pdVar9 = (pFVar7->dx_).ptr_to_data + i;
  }
  dVar1 = *pdVar9;
  dVar2 = (this->left_->fadexpr_).left_.constant_;
  pFVar8 = (this_00->left_->fadexpr_).left_;
  dVar3 = ((pFVar8->fadexpr_).left_)->val_;
  dVar4 = ((pFVar8->fadexpr_).right_)->val_;
  dVar5 = ((this_00->left_->fadexpr_).right_)->val_;
  dVar6 = (this_00->right_).constant_;
  vVar10 = FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>
           ::dx(this_00,i);
  return vVar10 * (this->left_->fadexpr_).left_.constant_ * ((this->left_->fadexpr_).right_)->val_ +
         ((dVar3 + dVar4 + dVar5) - dVar6) * dVar1 * dVar2;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}